

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cc
# Opt level: O0

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
google::protobuf::compiler::cpp::MakeTrackerCalls
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Descriptor *message,Options *opts)

{
  Span<const_google::protobuf::compiler::cpp::(anonymous_namespace)::Call> calls;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> thiz;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> thiz_00;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> thiz_01;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> thiz_02;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> thiz_03;
  initializer_list<google::protobuf::compiler::cpp::(anonymous_namespace)::Call> v;
  bool bVar1;
  char *pcVar2;
  Call *local_f60;
  string_view local_e90;
  string_view local_e80;
  Call local_e70;
  string_view local_e10;
  string_view local_e00;
  string_view local_df0;
  string_view local_de0;
  string_view local_dd0;
  string_view local_dc0;
  string_view local_db0;
  string_view local_da0;
  string_view local_d90;
  string_view local_d80;
  string_view local_d70;
  string_view local_d60;
  string_view local_d50;
  string_view local_d40;
  string_view local_d30;
  string_view local_d20;
  string_view local_d10;
  string_view local_d00;
  string_view local_cf0;
  string_view local_ce0;
  string_view local_cd0;
  string_view local_cc0;
  string_view local_cb0;
  string_view local_ca0;
  string_view local_c90;
  string_view local_c80;
  string_view local_c70;
  string_view local_c60;
  string_view local_c50;
  string_view local_c40;
  string_view local_c30;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_c20;
  undefined8 local_c10;
  string_view local_c08;
  string_view local_bf8;
  Call local_be8;
  Call local_b88;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_b28;
  undefined8 local_b18;
  string_view local_b10;
  string_view local_b00;
  Call local_af0;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_a88;
  undefined8 local_a78;
  string_view local_a70;
  string_view local_a60;
  Call local_a50;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_9f0;
  undefined8 local_9e0;
  string_view local_9d8;
  string_view local_9c8;
  Call local_9b8;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_958;
  undefined8 local_948;
  string_view local_930;
  string_view local_920;
  Call local_910;
  Call *local_8b0;
  Call local_8a8;
  Call local_848;
  Call local_7e8;
  Call local_788;
  Call local_728;
  Call local_6c8;
  Call local_668;
  Call local_608;
  Call local_5a8;
  Call local_548;
  Call local_4e8;
  Call local_488;
  Call local_428;
  Call local_3c8;
  Call local_368;
  Call local_308;
  Call local_2a8;
  Call local_248;
  Call local_1e8;
  Call local_188;
  Call local_128;
  undefined1 local_c8 [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  undefined1 auStack_78 [8];
  anon_class_16_1_a7e182c6 list_extn_accessor;
  anon_class_16_1_a7e182c6 add_extn_accessor;
  anon_class_16_1_a7e182c6 index_extn_accessor;
  anon_class_16_1_a7e182c6 primitive_extn_accessor;
  undefined1 auStack_30 [8];
  string_view extns;
  Options *opts_local;
  Descriptor *message_local;
  
  extns._M_str = (char *)opts;
  bVar1 = IsMapEntryMessage(message);
  pcVar2 = "_impl_._extensions_";
  if (bVar1) {
    pcVar2 = "_extensions_";
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30,pcVar2);
  pcVar2 = extns._M_str;
  auStack_78._0_4_ = auStack_30._0_4_;
  auStack_78._4_4_ = auStack_30._4_4_;
  list_extn_accessor.extns._M_len._0_4_ = (undefined4)extns._M_len;
  list_extn_accessor.extns._M_len._4_4_ = extns._M_len._4_4_;
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional(&local_a0);
  local_8b0 = &local_8a8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_920,"serialize");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_930,"OnSerialize")
  ;
  anon_unknown_0::Call::Call(&local_910,local_920,local_930);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[7],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_958._M_value
             ,(char (*) [7])"&this_");
  thiz.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_958._M_value._M_str;
  thiz.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_958._M_value._M_len;
  thiz.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_948;
  anon_unknown_0::Call::This(&local_8a8,&local_910,thiz);
  local_8b0 = &local_848;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_9c8,"deserialize")
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_9d8,"OnDeserialize");
  anon_unknown_0::Call::Call(&local_9b8,local_9c8,local_9d8);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[6],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_9f0._M_value
             ,(char (*) [6])0xaf4d93);
  thiz_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_9f0._M_value._M_str;
  thiz_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_9f0._M_value._M_len;
  thiz_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_9e0;
  anon_unknown_0::Call::This(&local_848,&local_9b8,thiz_00);
  local_8b0 = &local_7e8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a60,"reflection");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_a70,"OnGetMetadata");
  anon_unknown_0::Call::Call(&local_a50,local_a60,local_a70);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_a88);
  thiz_01.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_a88._M_value._M_str;
  thiz_01.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_a88._M_value._M_len;
  thiz_01.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_a78;
  anon_unknown_0::Call::This(&local_7e8,&local_a50,thiz_01);
  local_8b0 = &local_788;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b00,"bytesize");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b10,"OnByteSize");
  anon_unknown_0::Call::Call(&local_af0,local_b00,local_b10);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[7],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_b28._M_value
             ,(char (*) [7])"&this_");
  thiz_02.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_b28._M_value._M_str;
  thiz_02.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_b28._M_value._M_len;
  thiz_02.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_b18;
  anon_unknown_0::Call::This(&local_788,&local_af0,thiz_02);
  local_8b0 = &local_728;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_bf8,"mergefrom");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c08,"OnMergeFrom")
  ;
  anon_unknown_0::Call::Call(&local_be8,local_bf8,local_c08);
  std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
  optional<const_char_(&)[6],_true>
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_c20._M_value
             ,(char (*) [6])0xaf4d93);
  thiz_03.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = local_c20._M_value._M_str;
  thiz_03.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_c20._M_value._M_len;
  thiz_03.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = local_c10;
  anon_unknown_0::Call::This(&local_b88,&local_be8,thiz_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c30,"&from");
  anon_unknown_0::Call::Arg<>(&local_728,&local_b88,local_c30);
  local_8b0 = &local_6c8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c40,"unknown_fields");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c50,"OnUnknownFields");
  anon_unknown_0::Call::Call(&local_6c8,local_c40,local_c50);
  local_8b0 = &local_668;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c60,"mutable_unknown_fields");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c70,"OnMutableUnknownFields");
  anon_unknown_0::Call::Call(&local_668,local_c60,local_c70);
  local_8b0 = &local_608;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c80,"extension_has");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c90,"OnHasExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_608,(anon_class_16_1_a7e182c6 *)&index_extn_accessor.extns._M_str,local_c80,
             local_c90);
  local_8b0 = &local_5a8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ca0,"extension_get");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_cb0,"OnGetExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_5a8,(anon_class_16_1_a7e182c6 *)&index_extn_accessor.extns._M_str,local_ca0,
             local_cb0);
  local_8b0 = &local_548;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_cc0,"extension_mutable");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_cd0,"OnMutableExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_548,(anon_class_16_1_a7e182c6 *)&index_extn_accessor.extns._M_str,local_cc0,
             local_cd0);
  local_8b0 = &local_4e8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_ce0,"extension_set");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_cf0,"OnSetExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_4e8,(anon_class_16_1_a7e182c6 *)&index_extn_accessor.extns._M_str,local_ce0,
             local_cf0);
  local_8b0 = &local_488;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d00,"extension_release");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d10,"OnReleaseExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_488,(anon_class_16_1_a7e182c6 *)&index_extn_accessor.extns._M_str,local_d00,
             local_d10);
  local_8b0 = &local_428;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d20,"repeated_extension_get");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d30,"OnGetExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_428,(anon_class_16_1_a7e182c6 *)&add_extn_accessor.extns._M_str,local_d20,
             local_d30);
  local_8b0 = &local_3c8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d40,"repeated_extension_mutable");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d50,"OnMutableExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_3c8,(anon_class_16_1_a7e182c6 *)&add_extn_accessor.extns._M_str,local_d40,
             local_d50);
  local_8b0 = &local_368;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d60,"repeated_extension_set");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d70,"OnSetExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_368,(anon_class_16_1_a7e182c6 *)&add_extn_accessor.extns._M_str,local_d60,
             local_d70);
  local_8b0 = &local_308;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d80,"repeated_extension_add");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d90,"OnAddExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_308,(anon_class_16_1_a7e182c6 *)&list_extn_accessor.extns._M_str,local_d80,
             local_d90);
  local_8b0 = &local_2a8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_da0,"repeated_extension_add_mutable");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_db0,"OnAddMutableExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_2a8,(anon_class_16_1_a7e182c6 *)&list_extn_accessor.extns._M_str,local_da0,
             local_db0);
  local_8b0 = &local_248;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_dc0,"extension_repeated_size");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_dd0,"OnExtensionSize");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_248,(anon_class_16_1_a7e182c6 *)auStack_78,local_dc0,local_dd0);
  local_8b0 = &local_1e8;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_de0,"repeated_extension_list");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_df0,"OnListExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_1e8,(anon_class_16_1_a7e182c6 *)auStack_78,local_de0,local_df0);
  local_8b0 = &local_188;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e00,"repeated_extension_list_mutable");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e10,"OnMutableListExtension");
  MakeTrackerCalls::anon_class_16_1_a7e182c6::operator()
            (&local_188,(anon_class_16_1_a7e182c6 *)auStack_78,local_e00,local_e10);
  local_8b0 = &local_128;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e80,"extension_clear");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e90,"OnClearExtension");
  anon_unknown_0::Call::Call(&local_e70,local_e80,local_e90);
  anon_unknown_0::Call::Suppressed(&local_128,&local_e70);
  local_c8._0_8_ = &local_8a8;
  local_c8._8_8_ = (char *)0x15;
  v._M_len = 0x15;
  v._M_array = (iterator)local_c8._0_8_;
  absl::lts_20250127::Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const>::
  Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const,google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const>
            ((Span<google::protobuf::compiler::cpp::(anonymous_namespace)::Call_const> *)&local_b8,v
            );
  calls.len_ = (size_type)local_c20._M_value._M_str;
  calls.ptr_ = (pointer)local_c20._M_value._M_len;
  anon_unknown_0::GenerateTrackerCalls
            (__return_storage_ptr__,(anon_unknown_0 *)pcVar2,(Options *)message,
             (Descriptor *)&local_a0,local_b8,calls);
  local_f60 = (Call *)local_c8;
  do {
    local_f60 = local_f60 + -1;
    anon_unknown_0::Call::~Call(local_f60);
  } while (local_f60 != &local_8a8);
  anon_unknown_0::Call::~Call(&local_e70);
  anon_unknown_0::Call::~Call(&local_b88);
  anon_unknown_0::Call::~Call(&local_be8);
  anon_unknown_0::Call::~Call(&local_af0);
  anon_unknown_0::Call::~Call(&local_a50);
  anon_unknown_0::Call::~Call(&local_9b8);
  anon_unknown_0::Call::~Call(&local_910);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeTrackerCalls(const Descriptor* message,
                                  const Options& opts) {
  absl::string_view extns =
      IsMapEntryMessage(message) ? "_extensions_" : "_impl_._extensions_";

  auto primitive_extn_accessor = [extns](absl::string_view var,
                                         absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, id.default_value_ref())", kTypeTraits,
             extns);
  };

  auto index_extn_accessor = [extns](absl::string_view var,
                                     absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, index)", kTypeTraits, extns);
  };

  auto add_extn_accessor = [extns](absl::string_view var,
                                   absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetPtr(id.number(), $1, $1.ExtensionSize(id.number()) - 1)",
             kTypeTraits, extns);
  };

  auto list_extn_accessor = [extns](absl::string_view var,
                                    absl::string_view call) {
    return Call(var, call)
        .Arg("id.number()")
        .Arg("$0::GetRepeatedPtr(id.number(), $1)", kTypeTraits, extns);
  };

  return GenerateTrackerCalls(
      opts, message, absl::nullopt,
      {
          Call("serialize", "OnSerialize").This("&this_"),
          Call("deserialize", "OnDeserialize").This("_this"),
          // TODO: Ideally annotate_reflection should not exist and we
          // need to annotate all reflective calls on our own, however, as this
          // is a cause for side effects, i.e. reading values dynamically, we
          // want the users know that dynamic access can happen.
          Call("reflection", "OnGetMetadata").This(absl::nullopt),
          Call("bytesize", "OnByteSize").This("&this_"),
          Call("mergefrom", "OnMergeFrom").This("_this").Arg("&from"),
          Call("unknown_fields", "OnUnknownFields"),
          Call("mutable_unknown_fields", "OnMutableUnknownFields"),

          // "Has" is here as users calling "has" on a repeated field is a
          // mistake.
          primitive_extn_accessor("extension_has", "OnHasExtension"),
          primitive_extn_accessor("extension_get", "OnGetExtension"),
          primitive_extn_accessor("extension_mutable", "OnMutableExtension"),
          primitive_extn_accessor("extension_set", "OnSetExtension"),
          primitive_extn_accessor("extension_release", "OnReleaseExtension"),

          index_extn_accessor("repeated_extension_get", "OnGetExtension"),
          index_extn_accessor("repeated_extension_mutable",
                              "OnMutableExtension"),
          index_extn_accessor("repeated_extension_set", "OnSetExtension"),

          add_extn_accessor("repeated_extension_add", "OnAddExtension"),
          add_extn_accessor("repeated_extension_add_mutable",
                            "OnAddMutableExtension"),

          list_extn_accessor("extension_repeated_size", "OnExtensionSize"),
          list_extn_accessor("repeated_extension_list", "OnListExtension"),
          list_extn_accessor("repeated_extension_list_mutable",
                             "OnMutableListExtension"),

          // Generic accessors such as "clear".
          // TODO: Generalize clear from both repeated and non
          // repeated calls, currently their underlying memory interfaces are
          // very different. Or think of removing clear callback as no usages
          // are needed and no memory exist
          Call("extension_clear", "OnClearExtension").Suppressed(),
      });
}